

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uparse.cpp
# Opt level: O2

void u_parseDelimitedFile
               (char *filename,char delimiter,char *(*fields) [2],int32_t fieldCount,
               UParseLineFn *lineFn,void *context,UErrorCode *pErrorCode)

{
  bool bVar1;
  int iVar2;
  UErrorCode UVar3;
  FileStream *fileStream;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  ulong uVar7;
  char line [10000];
  
  if (*pErrorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    if (((fieldCount < 1) || (fields == (char *(*) [2])0x0)) || (lineFn == (UParseLineFn *)0x0)) {
      *pErrorCode = U_ILLEGAL_ARGUMENT_ERROR;
    }
    else {
      if (((filename == (char *)0x0) || (*filename == '\0')) ||
         ((*filename == '-' && (filename[1] == '\0')))) {
        bVar1 = true;
        fileStream = T_FileStream_stdin();
      }
      else {
        fileStream = T_FileStream_open(filename,"r");
        bVar1 = false;
      }
      if (fileStream == (FileStream *)0x0) {
        *pErrorCode = U_FILE_ACCESS_ERROR;
      }
      else {
        while (pcVar4 = T_FileStream_readLine(fileStream,line,10000), pcVar4 != (char *)0x0) {
          u_rtrim(line);
          pcVar5 = u_skipWhitespace(line);
          pcVar4 = line;
          if ((*pcVar5 == '#') && (pcVar5 = u_skipWhitespace(pcVar5 + 1), *pcVar5 == '@')) {
            pcVar5 = u_skipWhitespace(pcVar5 + 1);
            iVar2 = strncmp(pcVar5,"missing",7);
            if ((iVar2 == 0) && (pcVar5 = u_skipWhitespace(pcVar5 + 7), *pcVar5 == ':')) {
              pcVar4 = u_skipWhitespace(pcVar5 + 1);
            }
          }
          UVar3 = U_USING_DEFAULT_WARNING;
          if (pcVar4 == line) {
            UVar3 = U_ZERO_ERROR;
          }
          *pErrorCode = UVar3;
          if ((*pcVar4 != '\0') && (*pcVar4 != '#')) {
            pcVar5 = strchr(pcVar4,0x23);
            if (pcVar5 != (char *)0x0) {
              do {
                pcVar6 = pcVar5;
                if ((pcVar6 <= pcVar4) || (0x20 < (ulong)(byte)pcVar6[-1])) break;
                pcVar5 = pcVar6 + -1;
              } while ((0x100002600U >> ((ulong)(byte)pcVar6[-1] & 0x3f) & 1) != 0);
              *pcVar6 = '\0';
            }
            pcVar5 = u_skipWhitespace(pcVar4);
            if (*pcVar5 != '\0') {
              uVar7 = 0;
              while (pcVar5 = pcVar4, uVar7 != (uint)fieldCount) {
                do {
                  pcVar6 = pcVar5;
                  if (*pcVar6 == delimiter) break;
                  pcVar5 = pcVar6 + 1;
                } while (*pcVar6 != '\0');
                fields[uVar7][0] = pcVar4;
                fields[uVar7][1] = pcVar6;
                uVar7 = uVar7 + 1;
                pcVar4 = pcVar6 + 1;
                if ((*pcVar6 == '\0') && (pcVar4 = pcVar6, (int)uVar7 < fieldCount)) {
                  *pErrorCode = U_PARSE_ERROR;
                  goto LAB_001eb926;
                }
              }
              if ((U_ZERO_ERROR < *pErrorCode) ||
                 ((*lineFn)(context,fields,fieldCount,pErrorCode), U_ZERO_ERROR < *pErrorCode))
              break;
            }
          }
        }
LAB_001eb926:
        if (!bVar1) {
          T_FileStream_close(fileStream);
        }
      }
    }
  }
  return;
}

Assistant:

U_CAPI void U_EXPORT2
u_parseDelimitedFile(const char *filename, char delimiter,
                     char *fields[][2], int32_t fieldCount,
                     UParseLineFn *lineFn, void *context,
                     UErrorCode *pErrorCode) {
    FileStream *file;
    char line[10000];
    char *start, *limit;
    int32_t i, length;

    if(U_FAILURE(*pErrorCode)) {
        return;
    }

    if(fields==NULL || lineFn==NULL || fieldCount<=0) {
        *pErrorCode=U_ILLEGAL_ARGUMENT_ERROR;
        return;
    }

    if(filename==NULL || *filename==0 || (*filename=='-' && filename[1]==0)) {
        filename=NULL;
        file=T_FileStream_stdin();
    } else {
        file=T_FileStream_open(filename, "r");
    }
    if(file==NULL) {
        *pErrorCode=U_FILE_ACCESS_ERROR;
        return;
    }

    while(T_FileStream_readLine(file, line, sizeof(line))!=NULL) {
        /* remove trailing newline characters */
        length=(int32_t)(u_rtrim(line)-line);

        /*
         * detect a line with # @missing:
         * start parsing after that, or else from the beginning of the line
         * set the default warning for @missing lines
         */
        start=(char *)getMissingLimit(line);
        if(start==line) {
            *pErrorCode=U_ZERO_ERROR;
        } else {
            *pErrorCode=U_USING_DEFAULT_WARNING;
        }

        /* skip this line if it is empty or a comment */
        if(*start==0 || *start=='#') {
            continue;
        }

        /* remove in-line comments */
        limit=uprv_strchr(start, '#');
        if(limit!=NULL) {
            /* get white space before the pound sign */
            while(limit>start && U_IS_INV_WHITESPACE(*(limit-1))) {
                --limit;
            }

            /* truncate the line */
            *limit=0;
        }

        /* skip lines with only whitespace */
        if(u_skipWhitespace(start)[0]==0) {
            continue;
        }

        /* for each field, call the corresponding field function */
        for(i=0; i<fieldCount; ++i) {
            /* set the limit pointer of this field */
            limit=start;
            while(*limit!=delimiter && *limit!=0) {
                ++limit;
            }

            /* set the field start and limit in the fields array */
            fields[i][0]=start;
            fields[i][1]=limit;

            /* set start to the beginning of the next field, if any */
            start=limit;
            if(*start!=0) {
                ++start;
            } else if(i+1<fieldCount) {
                *pErrorCode=U_PARSE_ERROR;
                limit=line+length;
                i=fieldCount;
                break;
            }
        }

        /* too few fields? */
        if(U_FAILURE(*pErrorCode)) {
            break;
        }

        /* call the field function */
        lineFn(context, fields, fieldCount, pErrorCode);
        if(U_FAILURE(*pErrorCode)) {
            break;
        }
    }

    if(filename!=NULL) {
        T_FileStream_close(file);
    }
}